

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O3

double ** one_two(double *input,int row,int col)

{
  double *pdVar1;
  double **ppdVar2;
  ulong uVar3;
  ulong uVar4;
  
  ppdVar2 = Make2DArray(row,col);
  if (0 < row) {
    uVar3 = 0;
    do {
      if (0 < col) {
        pdVar1 = ppdVar2[uVar3];
        uVar4 = 0;
        do {
          pdVar1[uVar4] = input[uVar4];
          uVar4 = uVar4 + 1;
        } while ((uint)col != uVar4);
      }
      uVar3 = uVar3 + 1;
      input = input + (uint)row;
    } while (uVar3 != (uint)row);
  }
  return ppdVar2;
}

Assistant:

double** one_two(double* input,int row,int col){
    double** output = Make2DArray(row,col);
    for(int i = 0;i < row;i++)
        for(int j = 0;j < col;j++)
            output[i][j] = input[i * row + j];
    return output;
}